

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O0

void Ssc_GiaSimClassCreate(Gia_Man_t *p,Vec_Int_t *vClass)

{
  int iVar1;
  int local_28;
  int i;
  int Ent;
  int EntPrev;
  int Repr;
  Vec_Int_t *vClass_local;
  Gia_Man_t *p_local;
  
  Ent = 0xfffffff;
  i = -1;
  iVar1 = Vec_IntSize(vClass);
  if (iVar1 < 1) {
    __assert_fail("Vec_IntSize(vClass) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscClass.c"
                  ,0x83,"void Ssc_GiaSimClassCreate(Gia_Man_t *, Vec_Int_t *)");
  }
  local_28 = 0;
  do {
    iVar1 = Vec_IntSize(vClass);
    if (iVar1 <= local_28) {
      Gia_ObjSetNext(p,i,0);
      return;
    }
    iVar1 = Vec_IntEntry(vClass,local_28);
    if (local_28 == 0) {
      Gia_ObjSetRepr(p,iVar1,0xfffffff);
      Ent = iVar1;
    }
    else {
      if (iVar1 <= Ent) {
        __assert_fail("Repr < Ent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscClass.c"
                      ,0x8e,"void Ssc_GiaSimClassCreate(Gia_Man_t *, Vec_Int_t *)");
      }
      Gia_ObjSetRepr(p,iVar1,Ent);
      Gia_ObjSetNext(p,i,iVar1);
    }
    local_28 = local_28 + 1;
    i = iVar1;
  } while( true );
}

Assistant:

void Ssc_GiaSimClassCreate( Gia_Man_t * p, Vec_Int_t * vClass )
{
    int Repr = GIA_VOID, EntPrev = -1, Ent, i;
    assert( Vec_IntSize(vClass) > 0 );
    Vec_IntForEachEntry( vClass, Ent, i )
    {
        if ( i == 0 )
        {
            Repr = Ent;
            Gia_ObjSetRepr( p, Ent, GIA_VOID );
            EntPrev = Ent;
        }
        else
        {
            assert( Repr < Ent );
            Gia_ObjSetRepr( p, Ent, Repr );
            Gia_ObjSetNext( p, EntPrev, Ent );
            EntPrev = Ent;
        }
    }
    Gia_ObjSetNext( p, EntPrev, 0 );
}